

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O3

int __thiscall cmake::Configure(cmake *this)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel>_>_>
  *this_00;
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  mapped_type mVar3;
  cmMakefileProfilingData *pcVar4;
  cmState *pcVar5;
  cmMessenger *pcVar6;
  bool bVar7;
  bool b;
  bool bVar8;
  int iVar9;
  const_iterator cVar10;
  mapped_type *pmVar11;
  cmValue cVar12;
  cmValue cVar13;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *pcVar14;
  string_view value;
  string_view value_00;
  string_view value_01;
  string_view value_02;
  optional<cmMakefileProfilingData::RAII> profilingRAII;
  key_type local_88;
  undefined1 local_61;
  RAII local_60;
  char local_58;
  long *local_50 [2];
  long local_40 [2];
  
  paVar2 = &local_88.field_2;
  local_88._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"project","");
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"configure","");
  pcVar4 = (this->ProfilingOutput)._M_t.
           super___uniq_ptr_impl<cmMakefileProfilingData,_std::default_delete<cmMakefileProfilingData>_>
           ._M_t.
           super__Tuple_impl<0UL,_cmMakefileProfilingData_*,_std::default_delete<cmMakefileProfilingData>_>
           .super__Head_base<0UL,_cmMakefileProfilingData_*,_false>._M_head_impl;
  local_58 = pcVar4 != (cmMakefileProfilingData *)0x0;
  if ((bool)local_58) {
    std::_Optional_payload_base<cmMakefileProfilingData::RAII>::
    _Storage<cmMakefileProfilingData::RAII,false>::
    _Storage<cmMakefileProfilingData&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::nullopt_t>
              ((_Storage<cmMakefileProfilingData::RAII,false> *)&local_60,pcVar4,&local_88,local_50,
               &local_61);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  local_88._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"deprecated","");
  this_00 = &this->DiagLevels;
  cVar10 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel>_>_>
           ::find(&this_00->_M_t,&local_88);
  p_Var1 = &(this->DiagLevels)._M_t._M_impl.super__Rb_tree_header;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  if ((_Rb_tree_header *)cVar10._M_node != p_Var1) {
    local_88._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"deprecated","");
    pmVar11 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel>_>_>
              ::operator[](this_00,&local_88);
    mVar3 = *pmVar11;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != paVar2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    if (mVar3 == DIAG_ERROR) {
      bVar8 = true;
      SetSuppressDeprecatedWarnings(this,false);
    }
    else {
      if (mVar3 == DIAG_WARN) {
        bVar8 = false;
      }
      else {
        if (mVar3 != DIAG_IGNORE) goto LAB_001ce59b;
        bVar8 = true;
      }
      SetSuppressDeprecatedWarnings(this,bVar8);
      bVar8 = false;
    }
    SetDeprecatedWarningsAsErrors(this,bVar8);
  }
LAB_001ce59b:
  local_88._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"dev","");
  cVar10 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel>_>_>
           ::find(&this_00->_M_t,&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  if ((_Rb_tree_header *)cVar10._M_node == p_Var1) goto LAB_001ce73d;
  pcVar5 = (this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
           super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
           super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
  local_88._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"CMAKE_WARN_DEPRECATED","");
  cVar12 = cmState::GetCacheEntryValue(pcVar5,&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  pcVar5 = (this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
           super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
           super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
  local_88._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"CMAKE_ERROR_DEPRECATED","");
  cVar13 = cmState::GetCacheEntryValue(pcVar5,&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  bVar8 = cVar12.Value != (string *)0x0;
  bVar7 = cVar13.Value != (string *)0x0;
  local_88._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"dev","");
  pmVar11 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel>_>_>
            ::operator[](this_00,&local_88);
  mVar3 = *pmVar11;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  if (mVar3 == DIAG_ERROR) {
    SetSuppressDevWarnings(this,false);
    SetDevWarningsAsErrors(this,true);
    if (bVar8 || bVar7) goto LAB_001ce73d;
    bVar8 = true;
    SetSuppressDeprecatedWarnings(this,false);
  }
  else {
    if (mVar3 == DIAG_WARN) {
      SetSuppressDevWarnings(this,false);
      SetDevWarningsAsErrors(this,false);
      if (bVar8 || bVar7) goto LAB_001ce73d;
      b = false;
    }
    else {
      if (mVar3 != DIAG_IGNORE) goto LAB_001ce73d;
      SetSuppressDevWarnings(this,true);
      SetDevWarningsAsErrors(this,false);
      b = true;
      if (bVar8 || bVar7) goto LAB_001ce73d;
    }
    SetSuppressDeprecatedWarnings(this,b);
    bVar8 = false;
  }
  SetDeprecatedWarningsAsErrors(this,bVar8);
LAB_001ce73d:
  pcVar5 = (this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
           super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
           super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
  local_88._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"CMAKE_WARN_DEPRECATED","");
  cVar12 = cmState::GetCacheEntryValue(pcVar5,&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  pcVar6 = (this->Messenger)._M_t.
           super___uniq_ptr_impl<cmMessenger,_std::default_delete<cmMessenger>_>._M_t.
           super__Tuple_impl<0UL,_cmMessenger_*,_std::default_delete<cmMessenger>_>.
           super__Head_base<0UL,_cmMessenger_*,_false>._M_head_impl;
  if (cVar12.Value == (string *)0x0) {
    bVar8 = false;
  }
  else {
    value._M_str = ((cVar12.Value)->_M_dataplus)._M_p;
    value._M_len = (cVar12.Value)->_M_string_length;
    bVar8 = cmValue::IsOff(value);
  }
  pcVar6->SuppressDeprecatedWarnings = bVar8;
  pcVar5 = (this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
           super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
           super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
  local_88._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"CMAKE_ERROR_DEPRECATED","");
  cVar12 = cmState::GetCacheEntryValue(pcVar5,&local_88);
  pcVar14 = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    pcVar14 = extraout_RDX_00;
  }
  pcVar6 = (this->Messenger)._M_t.
           super___uniq_ptr_impl<cmMessenger,_std::default_delete<cmMessenger>_>._M_t.
           super__Tuple_impl<0UL,_cmMessenger_*,_std::default_delete<cmMessenger>_>.
           super__Head_base<0UL,_cmMessenger_*,_false>._M_head_impl;
  if (cVar12.Value == (string *)0x0) {
    bVar8 = false;
  }
  else {
    value_01._M_str = pcVar14;
    value_01._M_len = (size_t)((cVar12.Value)->_M_dataplus)._M_p;
    bVar8 = cmValue::IsOn((cmValue *)(cVar12.Value)->_M_string_length,value_01);
  }
  pcVar6->DeprecatedWarningsAsErrors = bVar8;
  pcVar5 = (this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
           super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
           super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
  local_88._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_88,"CMAKE_SUPPRESS_DEVELOPER_WARNINGS","");
  cVar12 = cmState::GetCacheEntryValue(pcVar5,&local_88);
  pcVar14 = extraout_RDX_01;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    pcVar14 = extraout_RDX_02;
  }
  pcVar6 = (this->Messenger)._M_t.
           super___uniq_ptr_impl<cmMessenger,_std::default_delete<cmMessenger>_>._M_t.
           super__Tuple_impl<0UL,_cmMessenger_*,_std::default_delete<cmMessenger>_>.
           super__Head_base<0UL,_cmMessenger_*,_false>._M_head_impl;
  if (cVar12.Value == (string *)0x0) {
    bVar8 = false;
  }
  else {
    value_02._M_str = pcVar14;
    value_02._M_len = (size_t)((cVar12.Value)->_M_dataplus)._M_p;
    bVar8 = cmValue::IsOn((cmValue *)(cVar12.Value)->_M_string_length,value_02);
  }
  pcVar6->SuppressDevWarnings = bVar8;
  pcVar5 = (this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
           super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
           super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
  local_88._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_88,"CMAKE_SUPPRESS_DEVELOPER_ERRORS","");
  cVar12 = cmState::GetCacheEntryValue(pcVar5,&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  pcVar6 = (this->Messenger)._M_t.
           super___uniq_ptr_impl<cmMessenger,_std::default_delete<cmMessenger>_>._M_t.
           super__Tuple_impl<0UL,_cmMessenger_*,_std::default_delete<cmMessenger>_>.
           super__Head_base<0UL,_cmMessenger_*,_false>._M_head_impl;
  if (cVar12.Value == (string *)0x0) {
    bVar8 = false;
  }
  else {
    value_00._M_str = ((cVar12.Value)->_M_dataplus)._M_p;
    value_00._M_len = (cVar12.Value)->_M_string_length;
    bVar8 = cmValue::IsOff(value_00);
  }
  pcVar6->DevWarningsAsErrors = bVar8;
  iVar9 = ActualConfigure(this);
  pcVar5 = (this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
           super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
           super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
  local_88._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_88,"__CMAKE_DELETE_CACHE_CHANGE_VARS_","");
  cVar12 = cmState::GetGlobalProperty(pcVar5,&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  if ((cVar12.Value != (string *)0x0) && ((cVar12.Value)->_M_string_length != 0)) {
    iVar9 = HandleDeleteCacheVariables(this,cVar12.Value);
  }
  if (local_58 == '\x01') {
    local_58 = 0;
    cmMakefileProfilingData::RAII::~RAII(&local_60);
  }
  return iVar9;
}

Assistant:

int cmake::Configure()
{
#if !defined(CMAKE_BOOTSTRAP)
  auto profilingRAII = this->CreateProfilingEntry("project", "configure");
#endif

  DiagLevel diagLevel;

  if (this->DiagLevels.count("deprecated") == 1) {

    diagLevel = this->DiagLevels["deprecated"];
    if (diagLevel == DIAG_IGNORE) {
      this->SetSuppressDeprecatedWarnings(true);
      this->SetDeprecatedWarningsAsErrors(false);
    } else if (diagLevel == DIAG_WARN) {
      this->SetSuppressDeprecatedWarnings(false);
      this->SetDeprecatedWarningsAsErrors(false);
    } else if (diagLevel == DIAG_ERROR) {
      this->SetSuppressDeprecatedWarnings(false);
      this->SetDeprecatedWarningsAsErrors(true);
    }
  }

  if (this->DiagLevels.count("dev") == 1) {
    bool setDeprecatedVariables = false;

    cmValue cachedWarnDeprecated =
      this->State->GetCacheEntryValue("CMAKE_WARN_DEPRECATED");
    cmValue cachedErrorDeprecated =
      this->State->GetCacheEntryValue("CMAKE_ERROR_DEPRECATED");

    // don't overwrite deprecated warning setting from a previous invocation
    if (!cachedWarnDeprecated && !cachedErrorDeprecated) {
      setDeprecatedVariables = true;
    }

    diagLevel = this->DiagLevels["dev"];
    if (diagLevel == DIAG_IGNORE) {
      this->SetSuppressDevWarnings(true);
      this->SetDevWarningsAsErrors(false);

      if (setDeprecatedVariables) {
        this->SetSuppressDeprecatedWarnings(true);
        this->SetDeprecatedWarningsAsErrors(false);
      }
    } else if (diagLevel == DIAG_WARN) {
      this->SetSuppressDevWarnings(false);
      this->SetDevWarningsAsErrors(false);

      if (setDeprecatedVariables) {
        this->SetSuppressDeprecatedWarnings(false);
        this->SetDeprecatedWarningsAsErrors(false);
      }
    } else if (diagLevel == DIAG_ERROR) {
      this->SetSuppressDevWarnings(false);
      this->SetDevWarningsAsErrors(true);

      if (setDeprecatedVariables) {
        this->SetSuppressDeprecatedWarnings(false);
        this->SetDeprecatedWarningsAsErrors(true);
      }
    }
  }

  // Cache variables may have already been set by a previous invocation,
  // so we cannot rely on command line options alone. Always ensure our
  // messenger is in sync with the cache.
  cmValue value = this->State->GetCacheEntryValue("CMAKE_WARN_DEPRECATED");
  this->Messenger->SetSuppressDeprecatedWarnings(value && value.IsOff());

  value = this->State->GetCacheEntryValue("CMAKE_ERROR_DEPRECATED");
  this->Messenger->SetDeprecatedWarningsAsErrors(value.IsOn());

  value = this->State->GetCacheEntryValue("CMAKE_SUPPRESS_DEVELOPER_WARNINGS");
  this->Messenger->SetSuppressDevWarnings(value.IsOn());

  value = this->State->GetCacheEntryValue("CMAKE_SUPPRESS_DEVELOPER_ERRORS");
  this->Messenger->SetDevWarningsAsErrors(value && value.IsOff());

  int ret = this->ActualConfigure();
  cmValue delCacheVars =
    this->State->GetGlobalProperty("__CMAKE_DELETE_CACHE_CHANGE_VARS_");
  if (delCacheVars && !delCacheVars->empty()) {
    return this->HandleDeleteCacheVariables(*delCacheVars);
  }
  return ret;
}